

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O1

void __thiscall cmCTestSubmitCommand::CheckArguments(cmCTestSubmitCommand *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  long lVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  cmCTestSubmitCommand *local_40;
  cmCTestSubmitCommand *local_38;
  
  local_40 = this;
  local_38 = this;
  if ((this->Parts).
      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_engaged == true) {
    _Var3._M_current =
         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          &(this->Parts).
           super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
           .
           super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_payload._M_value.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    pbVar1 = *(pointer *)
              ((long)&(this->Parts).
                      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_payload._M_value.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              + 8);
    lVar4 = (long)pbVar1 - (long)_Var3._M_current >> 7;
    if (0 < lVar4) {
      lVar4 = lVar4 + 1;
      do {
        bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::
                operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)&local_40,
                           _Var3);
        _Var5._M_current = _Var3._M_current;
        if (bVar2) goto LAB_001ede49;
        bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::
                operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)&local_40,
                           _Var3._M_current + 1);
        _Var5._M_current = _Var3._M_current + 1;
        if (bVar2) goto LAB_001ede49;
        bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::
                operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)&local_40,
                           _Var3._M_current + 2);
        _Var5._M_current = _Var3._M_current + 2;
        if (bVar2) goto LAB_001ede49;
        bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::
                operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)&local_40,
                           _Var3._M_current + 3);
        _Var5._M_current = _Var3._M_current + 3;
        if (bVar2) goto LAB_001ede49;
        _Var3._M_current = _Var3._M_current + 4;
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    lVar4 = (long)pbVar1 - (long)_Var3._M_current >> 5;
    if (lVar4 == 1) {
LAB_001ede33:
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)&local_40,_Var3)
      ;
      _Var5._M_current = _Var3._M_current;
      if (!bVar2) {
        _Var5._M_current = pbVar1;
      }
    }
    else if (lVar4 == 2) {
LAB_001ede1e:
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)&local_40,_Var3)
      ;
      _Var5._M_current = _Var3._M_current;
      if (!bVar2) {
        _Var3._M_current = _Var3._M_current + 1;
        goto LAB_001ede33;
      }
    }
    else {
      _Var5._M_current = pbVar1;
      if ((lVar4 == 3) &&
         (bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::
                  operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)&local_40,
                             _Var3), _Var5._M_current = _Var3._M_current, !bVar2)) {
        _Var3._M_current = _Var3._M_current + 1;
        goto LAB_001ede1e;
      }
    }
LAB_001ede49:
    _Var3._M_current = _Var5._M_current + 1;
    if (_Var3._M_current != pbVar1 && _Var5._M_current != pbVar1) {
      do {
        bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_0>::
                operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__0> *)&local_38,
                           _Var3);
        if (!bVar2) {
          std::__cxx11::string::operator=((string *)_Var5._M_current,(string *)_Var3._M_current);
          _Var5._M_current = _Var5._M_current + 1;
        }
        _Var3._M_current = _Var3._M_current + 1;
      } while (_Var3._M_current != pbVar1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&this->Parts,(iterator)_Var5._M_current,
               *(pointer *)
                ((long)&(this->Parts).
                        super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_payload._M_value.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                + 8));
  }
  if ((this->Files).
      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_engaged != true) {
    return;
  }
  _Var3._M_current =
       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
        &(this->Files).
         super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
         .
         super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_payload._M_value.
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  pbVar1 = *(pointer *)
            ((long)&(this->Files).
                    super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_payload._M_value.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            + 8);
  lVar4 = (long)pbVar1 - (long)_Var3._M_current >> 7;
  local_40 = this;
  local_38 = this;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)&local_40,_Var3)
      ;
      _Var5._M_current = _Var3._M_current;
      if (bVar2) goto LAB_001edf9a;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)&local_40,
                         _Var3._M_current + 1);
      _Var5._M_current = _Var3._M_current + 1;
      if (bVar2) goto LAB_001edf9a;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)&local_40,
                         _Var3._M_current + 2);
      _Var5._M_current = _Var3._M_current + 2;
      if (bVar2) goto LAB_001edf9a;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)&local_40,
                         _Var3._M_current + 3);
      _Var5._M_current = _Var3._M_current + 3;
      if (bVar2) goto LAB_001edf9a;
      _Var3._M_current = _Var3._M_current + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = (long)pbVar1 - (long)_Var3._M_current >> 5;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var5._M_current = pbVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::
                  operator()((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)&local_40,
                             _Var3), _Var5._M_current = _Var3._M_current, bVar2)) goto LAB_001edf9a;
      _Var3._M_current = _Var3._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                      ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)&local_40,_Var3);
    _Var5._M_current = _Var3._M_current;
    if (bVar2) goto LAB_001edf9a;
    _Var3._M_current = _Var3._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                    ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)&local_40,_Var3);
  _Var5._M_current = _Var3._M_current;
  if (!bVar2) {
    _Var5._M_current = pbVar1;
  }
LAB_001edf9a:
  _Var3._M_current = _Var5._M_current + 1;
  if (_Var3._M_current != pbVar1 && _Var5._M_current != pbVar1) {
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestSubmitCommand::CheckArguments()::$_1>::operator()
                        ((_Iter_pred<cmCTestSubmitCommand::CheckArguments()::__1> *)&local_38,_Var3)
      ;
      if (!bVar2) {
        std::__cxx11::string::operator=((string *)_Var5._M_current,(string *)_Var3._M_current);
        _Var5._M_current = _Var5._M_current + 1;
      }
      _Var3._M_current = _Var3._M_current + 1;
    } while (_Var3._M_current != pbVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&this->Files,(iterator)_Var5._M_current,
             *(pointer *)
              ((long)&(this->Files).
                      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_payload._M_value.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              + 8));
  return;
}

Assistant:

void cmCTestSubmitCommand::CheckArguments()
{
  if (this->Parts) {
    cm::erase_if(*(this->Parts), [this](std::string const& arg) -> bool {
      cmCTest::Part p = this->CTest->GetPartFromName(arg);
      if (p == cmCTest::PartCount) {
        std::ostringstream e;
        e << "Part name \"" << arg << "\" is invalid.";
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        return true;
      }
      return false;
    });
  }

  if (this->Files) {
    cm::erase_if(*(this->Files), [this](std::string const& arg) -> bool {
      if (!cmSystemTools::FileExists(arg)) {
        std::ostringstream e;
        e << "File \"" << arg << "\" does not exist. Cannot submit "
          << "a non-existent file.";
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        return true;
      }
      return false;
    });
  }
}